

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_file_reader.cc
# Opt level: O3

bool __thiscall
draco::StdioFileReader::ReadFileToBuffer
          (StdioFileReader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  bool bVar4;
  size_type __new_size;
  
  if (buffer != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    iVar2 = (*(this->super_FileReaderInterface)._vptr_FileReaderInterface[4])(this);
    __new_size = CONCAT44(extraout_var,iVar2);
    if (__new_size == 0) {
      ReadFileToBuffer();
      bVar4 = false;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,__new_size);
      sVar3 = fread((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start,1,__new_size,(FILE *)this->file_);
      bVar4 = sVar3 == __new_size;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool StdioFileReader::ReadFileToBuffer(std::vector<uint8_t> *buffer) {
  if (buffer == nullptr) {
    return false;
  }
  buffer->clear();

  const size_t file_size = GetFileSize();
  if (file_size == 0) {
    FILEREADER_LOG_ERROR("Unable to obtain file size or file empty");
    return false;
  }

  buffer->resize(file_size);
  return fread(buffer->data(), 1, file_size, file_) == file_size;
}